

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O0

void __thiscall Fl_Browser_::draw(Fl_Browser_ *this)

{
  bool bVar1;
  byte bVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Color FVar8;
  uint uVar9;
  Fl_Align FVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fl_Browser_ *pFVar11;
  undefined4 extraout_var_01;
  Fl_Group *this_00;
  int local_f4;
  int local_e4;
  int local_d4;
  int local_d0;
  Fl_Boxtype local_ac;
  Fl_Boxtype local_84;
  Fl_Color local_80;
  Fl_Boxtype local_64;
  int local_54;
  int dy;
  int scrollsize;
  int ww;
  int hh;
  int yy;
  void *l;
  Fl_Boxtype b;
  int dont_repeat;
  int H;
  int W;
  int Y;
  int X;
  int full_height_;
  int full_width_;
  int drawsquare;
  Fl_Browser_ *this_local;
  
  full_height_ = 0;
  _full_width_ = this;
  update_top(this);
  X = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x15])();
  Y = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])();
  bbox(this,&W,&H,&dont_repeat,(int *)&b);
  bVar1 = false;
  while( true ) {
    bVar2 = Fl_Widget::damage((Fl_Widget *)this);
    if ((bVar2 & 0x80) != 0) {
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      if (FVar3 == FL_NO_BOX) {
        local_64 = FL_DOWN_BOX;
      }
      else {
        local_64 = Fl_Widget::box((Fl_Widget *)this);
      }
      iVar4 = Fl_Widget::x((Fl_Widget *)this);
      iVar5 = Fl_Widget::y((Fl_Widget *)this);
      iVar6 = Fl_Widget::w((Fl_Widget *)this);
      iVar7 = Fl_Widget::h((Fl_Widget *)this);
      FVar8 = Fl_Widget::color((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,local_64,iVar4,iVar5,iVar6,iVar7,FVar8);
      full_height_ = 1;
    }
    if (((this->has_scrollbar_ & 2) == 0) ||
       ((((this->has_scrollbar_ & 4) == 0 && (this->position_ == 0)) && (Y <= (int)b)))) {
      iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
      this->top_ = (void *)CONCAT44(extraout_var,iVar4);
      this->offset_ = 0;
      this->real_position_ = 0;
      uVar9 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
      if (uVar9 != 0) {
        Fl_Widget::clear_visible((Fl_Widget *)&this->scrollbar);
        bVar2 = Fl_Widget::damage((Fl_Widget *)this);
        Fl_Widget::clear_damage((Fl_Widget *)this,bVar2 | 4);
      }
    }
    else {
      uVar9 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
      if (uVar9 == 0) {
        Fl_Widget::set_visible((Fl_Widget *)&this->scrollbar);
        full_height_ = 1;
        bbox(this,&W,&H,&dont_repeat,(int *)&b);
      }
    }
    if (((this->has_scrollbar_ & 1) == 0) ||
       ((((this->has_scrollbar_ & 4) == 0 && (this->hposition_ == 0)) && (X <= dont_repeat)))) {
      this->real_hposition_ = 0;
      uVar9 = Fl_Widget::visible((Fl_Widget *)&this->hscrollbar);
      if (uVar9 != 0) {
        Fl_Widget::clear_visible((Fl_Widget *)&this->hscrollbar);
        bVar2 = Fl_Widget::damage((Fl_Widget *)this);
        Fl_Widget::clear_damage((Fl_Widget *)this,bVar2 | 4);
      }
    }
    else {
      uVar9 = Fl_Widget::visible((Fl_Widget *)&this->hscrollbar);
      if (uVar9 == 0) {
        Fl_Widget::set_visible((Fl_Widget *)&this->hscrollbar);
        full_height_ = 1;
        bbox(this,&W,&H,&dont_repeat,(int *)&b);
      }
    }
    if (((this->has_scrollbar_ & 2) == 0) ||
       ((((this->has_scrollbar_ & 4) == 0 && (this->position_ == 0)) && (Y <= (int)b)))) {
      iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])();
      this->top_ = (void *)CONCAT44(extraout_var_00,iVar4);
      this->offset_ = 0;
      this->real_position_ = 0;
      uVar9 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
      if (uVar9 != 0) {
        Fl_Widget::clear_visible((Fl_Widget *)&this->scrollbar);
        bVar2 = Fl_Widget::damage((Fl_Widget *)this);
        Fl_Widget::clear_damage((Fl_Widget *)this,bVar2 | 4);
      }
    }
    else {
      uVar9 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
      if (uVar9 == 0) {
        Fl_Widget::set_visible((Fl_Widget *)&this->scrollbar);
        full_height_ = 1;
        bbox(this,&W,&H,&dont_repeat,(int *)&b);
      }
    }
    bbox(this,&W,&H,&dont_repeat,(int *)&b);
    fl_push_clip(W,H,dont_repeat,b);
    _hh = top(this);
    ww = -this->offset_;
    while (_hh != (void *)0x0 && ww < (int)b) {
      uVar9 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,_hh);
      if (0 < (int)uVar9) {
        bVar2 = Fl_Widget::damage((Fl_Widget *)this);
        if ((((bVar2 & 0x84) != 0) || (_hh == this->redraw1)) || (_hh == this->redraw2)) {
          iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,_hh);
          if (iVar4 == 0) {
            bVar2 = Fl_Widget::damage((Fl_Widget *)this);
            if ((bVar2 & 0x80) == 0) {
              fl_push_clip(W,ww + H,dont_repeat,uVar9);
              FVar3 = Fl_Widget::box((Fl_Widget *)this);
              if (FVar3 == FL_NO_BOX) {
                local_84 = FL_DOWN_BOX;
              }
              else {
                local_84 = Fl_Widget::box((Fl_Widget *)this);
              }
              iVar4 = Fl_Widget::x((Fl_Widget *)this);
              iVar5 = Fl_Widget::y((Fl_Widget *)this);
              iVar6 = Fl_Widget::w((Fl_Widget *)this);
              iVar7 = Fl_Widget::h((Fl_Widget *)this);
              FVar8 = Fl_Widget::color((Fl_Widget *)this);
              Fl_Widget::draw_box((Fl_Widget *)this,local_84,iVar4,iVar5,iVar6,iVar7,FVar8);
              fl_pop_clip();
            }
          }
          else {
            iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
            if (iVar4 == 0) {
              FVar8 = Fl_Widget::selection_color((Fl_Widget *)this);
              local_80 = fl_inactive(FVar8);
            }
            else {
              local_80 = Fl_Widget::selection_color((Fl_Widget *)this);
            }
            fl_color(local_80);
            fl_rectf(W,ww + H,dont_repeat,uVar9);
          }
          (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x11])
                    (this,_hh,(ulong)(uint)(W - this->hposition_),(ulong)(uint)(ww + H),
                     (ulong)(uint)(dont_repeat + this->hposition_),(ulong)uVar9);
          if ((_hh == this->selection_) &&
             (pFVar11 = (Fl_Browser_ *)Fl::focus(), iVar5 = W, iVar4 = dont_repeat, pFVar11 == this)
             ) {
            iVar6 = ww + H;
            FVar8 = Fl_Widget::color((Fl_Widget *)this);
            Fl_Widget::draw_box((Fl_Widget *)this,FL_BORDER_FRAME,iVar5,iVar6,iVar4,uVar9,FVar8);
            Fl_Widget::draw_focus((Fl_Widget *)this,FL_NO_BOX,W,ww + H,dont_repeat + 1,uVar9 + 1);
          }
          iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xf])(this,_hh);
          if (this->max_width < iVar4) {
            this->max_width = iVar4;
            this->max_width_item = _hh;
          }
        }
        ww = uVar9 + ww;
      }
      iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,_hh);
      _hh = (void *)CONCAT44(extraout_var_01,iVar4);
    }
    bVar2 = Fl_Widget::damage((Fl_Widget *)this);
    if (((bVar2 & 0x80) == 0) && (ww < (int)b)) {
      fl_push_clip(W,ww + H,dont_repeat,b - ww);
      FVar3 = Fl_Widget::box((Fl_Widget *)this);
      if (FVar3 == FL_NO_BOX) {
        local_ac = FL_DOWN_BOX;
      }
      else {
        local_ac = Fl_Widget::box((Fl_Widget *)this);
      }
      iVar4 = Fl_Widget::x((Fl_Widget *)this);
      iVar5 = Fl_Widget::y((Fl_Widget *)this);
      iVar6 = Fl_Widget::w((Fl_Widget *)this);
      iVar7 = Fl_Widget::h((Fl_Widget *)this);
      FVar8 = Fl_Widget::color((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,local_ac,iVar4,iVar5,iVar6,iVar7,FVar8);
      fl_pop_clip();
    }
    fl_pop_clip();
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    iVar5 = Fl_Widget::y((Fl_Widget *)this);
    iVar6 = Fl_Widget::w((Fl_Widget *)this);
    iVar7 = Fl_Widget::h((Fl_Widget *)this);
    fl_push_clip(iVar4,iVar5,iVar6,iVar7);
    this->redraw2 = (void *)0x0;
    this->redraw1 = (void *)0x0;
    if (bVar1) break;
    bVar1 = true;
    Y = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])();
    X = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x15])();
    if (((this->has_scrollbar_ & 2) == 0) ||
       ((((this->has_scrollbar_ & 4) == 0 && (this->position_ == 0)) && (Y <= (int)b)))) {
      uVar9 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
      if (uVar9 == 0) goto LAB_001d6f33;
      Fl_Widget::damage((Fl_Widget *)this,0x80);
      fl_pop_clip();
    }
    else {
      uVar9 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
      if (uVar9 == 0) {
        Fl_Widget::damage((Fl_Widget *)this,0x80);
        fl_pop_clip();
      }
      else {
LAB_001d6f33:
        if (((this->has_scrollbar_ & 1) == 0) ||
           ((((this->has_scrollbar_ & 4) == 0 && (this->hposition_ == 0)) && (X <= dont_repeat)))) {
          uVar9 = Fl_Widget::visible((Fl_Widget *)&this->hscrollbar);
          if (uVar9 == 0) break;
          Fl_Widget::damage((Fl_Widget *)this,0x80);
          fl_pop_clip();
        }
        else {
          uVar9 = Fl_Widget::visible((Fl_Widget *)&this->hscrollbar);
          if (uVar9 != 0) break;
          Fl_Widget::damage((Fl_Widget *)this,0x80);
          fl_pop_clip();
        }
      }
    }
  }
  if (this->scrollbar_size_ == 0) {
    local_d0 = Fl::scrollbar_size();
  }
  else {
    local_d0 = this->scrollbar_size_;
  }
  if (this->top_ == (void *)0x0) {
    local_d4 = 0;
  }
  else {
    local_d4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this,this->top_);
  }
  local_54 = local_d4;
  if (local_d4 < 10) {
    local_54 = 10;
  }
  uVar9 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
  if (uVar9 != 0) {
    FVar10 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    local_e4 = dont_repeat;
    if ((FVar10 & 4) != 0) {
      local_e4 = -local_d0;
    }
    local_e4 = W + local_e4;
    Fl_Widget::damage_resize((Fl_Widget *)&this->scrollbar,local_e4,H,local_d0,b);
    Fl_Scrollbar::value(&this->scrollbar,this->position_,b,0,Y);
    Fl_Scrollbar::linesize(&this->scrollbar,local_54);
    if (full_height_ == 0) {
      Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)&this->scrollbar);
    }
    else {
      Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)&this->scrollbar);
    }
  }
  uVar9 = Fl_Widget::visible((Fl_Widget *)&this->hscrollbar);
  if (uVar9 != 0) {
    FVar10 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    if ((FVar10 & 1) != 0) {
      b = -local_d0;
    }
    local_f4 = H + b;
    Fl_Widget::damage_resize((Fl_Widget *)&this->hscrollbar,W,local_f4,dont_repeat,local_d0);
    Fl_Scrollbar::value(&this->hscrollbar,this->hposition_,dont_repeat,0,X);
    Fl_Scrollbar::linesize(&this->hscrollbar,local_54);
    if (full_height_ == 0) {
      Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)&this->hscrollbar);
    }
    else {
      Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)&this->hscrollbar);
    }
  }
  if (((full_height_ != 0) &&
      (uVar9 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar), uVar9 != 0)) &&
     (uVar9 = Fl_Widget::visible((Fl_Widget *)&this->hscrollbar), uVar9 != 0)) {
    this_00 = Fl_Widget::parent((Fl_Widget *)this);
    FVar8 = Fl_Widget::color(&this_00->super_Fl_Widget);
    fl_color(FVar8);
    iVar4 = Fl_Widget::x((Fl_Widget *)&this->scrollbar);
    iVar5 = Fl_Widget::y((Fl_Widget *)&this->hscrollbar);
    fl_rectf(iVar4,iVar5,local_d0,local_d0);
  }
  this->real_hposition_ = this->hposition_;
  fl_pop_clip();
  return;
}

Assistant:

void Fl_Browser_::draw() {
  int drawsquare = 0;
  update_top();
  int full_width_ = full_width();
  int full_height_ = full_height();
  int X, Y, W, H; bbox(X, Y, W, H);
  int dont_repeat = 0;
J1:
  if (damage() & FL_DAMAGE_ALL) { // redraw the box if full redraw
    Fl_Boxtype b = box() ? box() : FL_DOWN_BOX;
    draw_box(b, x(), y(), w(), h(), color());
    drawsquare = 1;
  }
  // see if scrollbar needs to be switched on/off:
  if ((has_scrollbar_ & VERTICAL) && (
	(has_scrollbar_ & ALWAYS_ON) || position_ || full_height_ > H)) {
    if (!scrollbar.visible()) {
      scrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    top_ = item_first(); real_position_ = offset_ = 0;
    if (scrollbar.visible()) {
      scrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  if ((has_scrollbar_ & HORIZONTAL) && (
	(has_scrollbar_ & ALWAYS_ON) || hposition_ || full_width_ > W)) {
    if (!hscrollbar.visible()) {
      hscrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    real_hposition_ = 0;
    if (hscrollbar.visible()) {
      hscrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  // Check the vertical scrollbar again, just in case it needs to be drawn
  // because the horizontal one is drawn.  There should be a cleaner way
  // to do this besides copying the same code...
  if ((has_scrollbar_ & VERTICAL) && (
	(has_scrollbar_ & ALWAYS_ON) || position_ || full_height_ > H)) {
    if (!scrollbar.visible()) {
      scrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    top_ = item_first(); real_position_ = offset_ = 0;
    if (scrollbar.visible()) {
      scrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  bbox(X, Y, W, H);

  fl_push_clip(X, Y, W, H);
  // for each line, draw it if full redraw or scrolled.  Erase background
  // if not a full redraw or if it is selected:
  void* l = top();
  int yy = -offset_;
  for (; l && yy < H; l = item_next(l)) {
    int hh = item_height(l);
    if (hh <= 0) continue;
    if ((damage()&(FL_DAMAGE_SCROLL|FL_DAMAGE_ALL)) || l == redraw1 || l == redraw2) {
      if (item_selected(l)) {
	fl_color(active_r() ? selection_color() : fl_inactive(selection_color()));
	fl_rectf(X, yy+Y, W, hh);
      } else if (!(damage()&FL_DAMAGE_ALL)) {
	fl_push_clip(X, yy+Y, W, hh);
	draw_box(box() ? box() : FL_DOWN_BOX, x(), y(), w(), h(), color());
	fl_pop_clip();
      }
      item_draw(l, X-hposition_, yy+Y, W+hposition_, hh);
      if (l == selection_ && Fl::focus() == this) {
	draw_box(FL_BORDER_FRAME, X, yy+Y, W, hh, color());
	draw_focus(FL_NO_BOX, X, yy+Y, W+1, hh+1);
      }
      int ww = item_width(l);
      if (ww > max_width) {max_width = ww; max_width_item = l;}
    }
    yy += hh;
  }
  // erase the area below last line:
  if (!(damage()&FL_DAMAGE_ALL) && yy < H) {
    fl_push_clip(X, yy+Y, W, H-yy);
    draw_box(box() ? box() : FL_DOWN_BOX, x(), y(), w(), h(), color());
    fl_pop_clip();
  }
  fl_pop_clip();

  fl_push_clip(x(),y(),w(),h());		// STR# 2886
  redraw1 = redraw2 = 0;
  if (!dont_repeat) {
    dont_repeat = 1;
    // see if changes to full_height caused by calls to slow_height
    // caused scrollbar state to change, in which case we have to redraw:
    full_height_ = full_height();
    full_width_ = full_width();
    if ((has_scrollbar_ & VERTICAL) &&
	((has_scrollbar_ & ALWAYS_ON) || position_ || full_height_>H)) {
      if (!scrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    } else {
      if (scrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    }
    if ((has_scrollbar_ & HORIZONTAL) &&
	((has_scrollbar_ & ALWAYS_ON) || hposition_ || full_width_>W)) {
      if (!hscrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    } else {
      if (hscrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    }
  }

  // update the scrollbars and redraw them:
  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  int dy = top_ ? item_quick_height(top_) : 0; if (dy < 10) dy = 10;
  if (scrollbar.visible()) {
    scrollbar.damage_resize(
	scrollbar.align()&FL_ALIGN_LEFT ? X-scrollsize : X+W,
	Y, scrollsize, H);
    scrollbar.value(position_, H, 0, full_height_);
    scrollbar.linesize(dy);
    if (drawsquare) draw_child(scrollbar);
    else update_child(scrollbar);
  }
  if (hscrollbar.visible()) {
    hscrollbar.damage_resize(
	X, scrollbar.align()&FL_ALIGN_TOP ? Y-scrollsize : Y+H,
	W, scrollsize);
    hscrollbar.value(hposition_, W, 0, full_width_);
    hscrollbar.linesize(dy);
    if (drawsquare) draw_child(hscrollbar);
    else update_child(hscrollbar);
  }

  // draw that little square between the scrollbars:
  if (drawsquare && scrollbar.visible() && hscrollbar.visible()) {
    fl_color(parent()->color());
    fl_rectf(scrollbar.x(), hscrollbar.y(), scrollsize, scrollsize);
  }

  real_hposition_ = hposition_;
  fl_pop_clip();
}